

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeFloatDebugType(Builder *this,int width)

{
  key_type kVar1;
  char *__s;
  Id IVar2;
  Id typeId;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *pIVar6;
  value_type local_78;
  key_type local_70 [4];
  Instruction *pIStack_60;
  int t;
  Instruction *type;
  string local_50;
  Id local_2c;
  char *pcStack_28;
  Id nameId;
  char *typeName;
  Builder *pBStack_18;
  int width_local;
  Builder *this_local;
  
  if (width == 0x10) {
    pcStack_28 = "float16_t";
  }
  else if (width == 0x40) {
    pcStack_28 = "double";
  }
  else {
    pcStack_28 = "float";
  }
  __s = pcStack_28;
  typeName._4_4_ = width;
  pBStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)((long)&type + 7));
  IVar2 = getStringId(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
  local_70[3] = 0;
  local_2c = IVar2;
  while( true ) {
    kVar1 = local_70[3];
    local_70[2] = 2;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_70 + 2);
    sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
    if ((int)sVar4 <= (int)kVar1) {
      pIVar6 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      typeId = makeVoidType(this);
      spv::Instruction::Instruction(pIVar6,IVar2,typeId,OpExtInst);
      pIStack_60 = pIVar6;
      spv::Instruction::reserveOperands(pIVar6,6);
      spv::Instruction::addIdOperand(pIStack_60,this->nonSemanticShaderDebugInfo);
      spv::Instruction::addImmediateOperand(pIStack_60,2);
      spv::Instruction::addIdOperand(pIStack_60,local_2c);
      pIVar6 = pIStack_60;
      IVar2 = makeUintConstant(this,typeName._4_4_,false);
      spv::Instruction::addIdOperand(pIVar6,IVar2);
      pIVar6 = pIStack_60;
      IVar2 = makeUintConstant(this,3,false);
      spv::Instruction::addIdOperand(pIVar6,IVar2);
      pIVar6 = pIStack_60;
      IVar2 = makeUintConstant(this,0,false);
      spv::Instruction::addIdOperand(pIVar6,IVar2);
      local_70[0] = 2;
      pmVar3 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedDebugTypes,local_70);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar3,&stack0xffffffffffffffa0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_78,
                 pIStack_60);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_78);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_78);
      Module::mapInstruction(&this->module,pIStack_60);
      IVar2 = spv::Instruction::getResultId(pIStack_60);
      return IVar2;
    }
    local_70[1] = 2;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_70 + 1);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar3,(long)(int)local_70[3]);
    pIStack_60 = *ppIVar5;
    IVar2 = spv::Instruction::getIdOperand(pIStack_60,0);
    if (((IVar2 == local_2c) &&
        (IVar2 = spv::Instruction::getIdOperand(pIStack_60,1), IVar2 == typeName._4_4_)) &&
       (IVar2 = spv::Instruction::getIdOperand(pIStack_60,2), IVar2 == 3)) break;
    local_70[3] = local_70[3] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_60);
  return IVar2;
}

Assistant:

Id Builder::makeFloatDebugType(int const width)
{
    const char* typeName = nullptr;
    switch (width) {
        case 16: typeName = "float16_t"; break;
        case 64: typeName = "double"; break;
        default: typeName = "float"; break;
    }
    auto nameId = getStringId(typeName);
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic][t];
        if (type->getIdOperand(0) == nameId &&
            type->getIdOperand(1) == static_cast<unsigned int>(width) &&
            type->getIdOperand(2) == NonSemanticShaderDebugInfo100Float)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(6);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeBasic);
    type->addIdOperand(nameId); // name id
    type->addIdOperand(makeUintConstant(width)); // size id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Float)); // encoding id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100None)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}